

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDocPtr xmlCtxtReadIO(xmlParserCtxtPtr ctxt,xmlInputReadCallback ioread,
                       xmlInputCloseCallback ioclose,void *ioctx,char *URL,char *encoding,
                       int options)

{
  xmlParserInputPtr input;
  xmlDocPtr pxVar1;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt,options);
    input = xmlCtxtNewInputFromIO(ctxt,URL,ioread,ioclose,ioctx,encoding,0);
    if (input != (xmlParserInputPtr)0x0) {
      pxVar1 = xmlCtxtParseDocument(ctxt,input);
      return pxVar1;
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCtxtReadIO(xmlParserCtxtPtr ctxt, xmlInputReadCallback ioread,
              xmlInputCloseCallback ioclose, void *ioctx,
	      const char *URL,
              const char *encoding, int options)
{
    xmlParserInputPtr input;

    if (ctxt == NULL)
        return(NULL);

    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromIO(ctxt, URL, ioread, ioclose, ioctx,
                                  encoding, 0);
    if (input == NULL)
        return(NULL);

    return(xmlCtxtParseDocument(ctxt, input));
}